

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlNewPropInternal(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value,int eatname)

{
  int iVar1;
  xmlNodePtr attr;
  xmlChar *pxVar2;
  xmlNodePtr pxVar3;
  xmlRegisterNodeFunc *pp_Var4;
  _xmlNode *local_60;
  xmlAttrPtr prev;
  _xmlNode *p_Stack_50;
  int res;
  xmlNodePtr tmp;
  xmlDocPtr doc;
  xmlAttrPtr cur;
  int eatname_local;
  xmlChar *value_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  
  tmp = (xmlNodePtr)0x0;
  if ((node != (xmlNodePtr)0x0) && (node->type != XML_ELEMENT_NODE)) {
    if ((eatname == 1) &&
       (((node->doc == (_xmlDoc *)0x0 || (node->doc->dict == (_xmlDict *)0x0)) ||
        (iVar1 = xmlDictOwns(node->doc->dict,name), iVar1 == 0)))) {
      (*xmlFree)(name);
    }
    return (xmlAttrPtr)0x0;
  }
  attr = (xmlNodePtr)(*xmlMalloc)(0x68);
  if (attr == (xmlNodePtr)0x0) {
    if ((eatname == 1) &&
       (((node == (xmlNodePtr)0x0 || (node->doc == (_xmlDoc *)0x0)) ||
        ((node->doc->dict == (_xmlDict *)0x0 ||
         (iVar1 = xmlDictOwns(node->doc->dict,name), iVar1 == 0)))))) {
      (*xmlFree)(name);
    }
    return (xmlAttrPtr)0x0;
  }
  memset(attr,0,0x68);
  attr->type = XML_ATTRIBUTE_NODE;
  attr->parent = node;
  if (node != (xmlNodePtr)0x0) {
    tmp = (xmlNodePtr)node->doc;
    attr->doc = (_xmlDoc *)tmp;
  }
  attr->ns = ns;
  if (eatname == 0) {
    if ((tmp == (xmlNodePtr)0x0) || (tmp[1].last == (_xmlNode *)0x0)) {
      pxVar2 = xmlStrdup(name);
      attr->name = pxVar2;
    }
    else {
      pxVar2 = xmlDictLookup((xmlDictPtr)tmp[1].last,name,-1);
      attr->name = pxVar2;
    }
    if (attr->name == (xmlChar *)0x0) goto LAB_00165c69;
  }
  else {
    attr->name = name;
  }
  if (value != (xmlChar *)0x0) {
    pxVar3 = xmlNewDocText((xmlDoc *)tmp,value);
    attr->children = pxVar3;
    if (attr->children != (_xmlNode *)0x0) {
      attr->last = (_xmlNode *)0x0;
      for (p_Stack_50 = attr->children; p_Stack_50 != (_xmlNode *)0x0; p_Stack_50 = p_Stack_50->next
          ) {
        p_Stack_50->parent = attr;
        if (p_Stack_50->next == (_xmlNode *)0x0) {
          attr->last = p_Stack_50;
        }
      }
      if ((tmp == (xmlNodePtr)0x0) ||
         ((iVar1 = xmlIsID((xmlDocPtr)tmp,node,(xmlAttrPtr)attr), -1 < iVar1 &&
          ((iVar1 != 1 || (iVar1 = xmlAddIDSafe((xmlAttrPtr)attr,value), -1 < iVar1))))))
      goto LAB_00165bde;
    }
LAB_00165c69:
    xmlFreeProp((xmlAttrPtr)attr);
    return (xmlAttrPtr)0x0;
  }
LAB_00165bde:
  if (node != (xmlNodePtr)0x0) {
    if (node->properties == (_xmlAttr *)0x0) {
      node->properties = (_xmlAttr *)attr;
    }
    else {
      for (local_60 = (_xmlNode *)node->properties; local_60->next != (_xmlNode *)0x0;
          local_60 = local_60->next) {
      }
      local_60->next = attr;
      attr->prev = local_60;
    }
  }
  if (xmlRegisterCallbacks == 0) {
    return (xmlAttrPtr)attr;
  }
  pp_Var4 = __xmlRegisterNodeDefaultValue();
  if (*pp_Var4 == (xmlRegisterNodeFunc)0x0) {
    return (xmlAttrPtr)attr;
  }
  pp_Var4 = __xmlRegisterNodeDefaultValue();
  (**pp_Var4)(attr);
  return (xmlAttrPtr)attr;
}

Assistant:

static xmlAttrPtr
xmlNewPropInternal(xmlNodePtr node, xmlNsPtr ns,
                   const xmlChar * name, const xmlChar * value,
                   int eatname)
{
    xmlAttrPtr cur;
    xmlDocPtr doc = NULL;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE)) {
        if ((eatname == 1) &&
	    ((node->doc == NULL) || (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        return (NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL) {
        if ((eatname == 1) &&
	    ((node == NULL) || (node->doc == NULL) ||
             (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        return (NULL);
    }
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    cur->parent = node;
    if (node != NULL) {
        doc = node->doc;
        cur->doc = doc;
    }
    cur->ns = ns;

    if (eatname == 0) {
        if ((doc != NULL) && (doc->dict != NULL))
            cur->name = (xmlChar *) xmlDictLookup(doc->dict, name, -1);
        else
            cur->name = xmlStrdup(name);
        if (cur->name == NULL)
            goto error;
    } else
        cur->name = name;

    if (value != NULL) {
        xmlNodePtr tmp;

        cur->children = xmlNewDocText(doc, value);
        if (cur->children == NULL)
            goto error;
        cur->last = NULL;
        tmp = cur->children;
        while (tmp != NULL) {
            tmp->parent = (xmlNodePtr) cur;
            if (tmp->next == NULL)
                cur->last = tmp;
            tmp = tmp->next;
        }

        if (doc != NULL) {
            int res = xmlIsID(doc, node, cur);

            if (res < 0)
                goto error;
            if ((res == 1) && (xmlAddIDSafe(cur, value) < 0))
                goto error;
        }
    }

    /*
     * Add it at the end to preserve parsing order ...
     */
    if (node != NULL) {
        if (node->properties == NULL) {
            node->properties = cur;
        } else {
            xmlAttrPtr prev = node->properties;

            while (prev->next != NULL)
                prev = prev->next;
            prev->next = cur;
            cur->prev = prev;
        }
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
        xmlRegisterNodeDefaultValue((xmlNodePtr) cur);
    return (cur);

error:
    xmlFreeProp(cur);
    return(NULL);
}